

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

Var Js::JavascriptNumber::EntryToFixed(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  uint formatDigits;
  int iVar6;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  JavascriptString *pJVar10;
  double dVar11;
  int in_stack_00000010;
  undefined1 local_78 [8];
  Type TStack_70;
  CallInfo local_68;
  undefined8 uStack_60;
  CallInfo local_58;
  CallInfo callInfo_local;
  double value;
  Var result;
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_58 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x26b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b8bca7;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&result,&local_58,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_58 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x26e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b8bca7;
    *puVar7 = 0;
  }
  if (((uint)result & 0xffffff) != 0) {
    pvVar8 = Arguments::operator[]((Arguments *)&result,0);
    BVar5 = GetThisValue(pvVar8,(double *)&callInfo_local);
    if (BVar5 != 0) {
      formatDigits = 0;
      if (((uint)result & 0xfffffe) != 0) {
        pvVar8 = Arguments::operator[]((Arguments *)&result,1);
        bVar4 = TaggedInt::Is(pvVar8);
        if (bVar4) {
          formatDigits = TaggedInt::ToInt32(pvVar8);
        }
        else {
          if (pvVar8 == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar4) goto LAB_00b8bca7;
            *puVar7 = 0;
          }
          bVar4 = TaggedInt::Is(pvVar8);
          if ((ulong)pvVar8 >> 0x32 == 0 && !bVar4) {
            pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
            if (pRVar9 == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar7 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
              if (!bVar4) goto LAB_00b8bca7;
              *puVar7 = 0;
            }
            TVar1 = ((pRVar9->type).ptr)->typeId;
            if ((int)TVar1 < 0x58) {
              formatDigits = 0;
              if (TVar1 == TypeIds_Undefined) goto LAB_00b8bbdd;
            }
            else {
              BVar5 = RecyclableObject::IsExternal(pRVar9);
              if (BVar5 == 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar7 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar4) goto LAB_00b8bca7;
                *puVar7 = 0;
              }
            }
          }
          dVar11 = JavascriptConversion::ToInteger(pvVar8,pSVar2);
          formatDigits = (uint)dVar11;
        }
        if (0x14 < formatDigits) {
          JavascriptError::ThrowRangeError(pSVar2,-0x7ff5ec5e,(PCWSTR)0x0);
        }
      }
LAB_00b8bbdd:
      local_68 = callInfo_local;
      uStack_60 = 0;
      BVar5 = IsNan((double)callInfo_local);
      if (BVar5 == 0) {
        if (1e+21 <= ABS((double)local_68)) {
          pJVar10 = ToStringRadix10((double)local_68,pSVar2);
        }
        else {
          pJVar10 = (JavascriptString *)
                    FormatDoubleToString((double)local_68,FormatFixed,formatDigits,pSVar2);
        }
      }
      else {
        pJVar10 = ToStringNan(pSVar2);
      }
      return pJVar10;
    }
    pvVar8 = Arguments::operator[]((Arguments *)&result,0);
    if (pvVar8 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b8bca7;
      *puVar7 = 0;
    }
    bVar4 = TaggedInt::Is(pvVar8);
    if (((ulong)pvVar8 >> 0x32 != 0) || (bVar4)) goto LAB_00b8bc93;
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b8bca7;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar9->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        pvVar8 = Arguments::operator[]((Arguments *)&result,0);
        pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
        TStack_70 = args.super_Arguments.Info;
        iVar6 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(pRVar9,EntryToFixed,local_78,&value);
        if (iVar6 != 0) {
          return (Var)value;
        }
      }
    }
    else {
      BVar5 = RecyclableObject::IsExternal(pRVar9);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_00b8bca7:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
    }
  }
LAB_00b8bc93:
  JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec3c,L"Number.prototype.toFixed");
}

Assistant:

Var JavascriptNumber::EntryToFixed(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toFixed"));
        }
        AssertMsg(args.Info.Count > 0, "negative arg count");

        // spec implies ToFixed is not generic. 'this' must be a number
        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToFixed, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toFixed"));
        }
        int fractionDigits = 0;
        bool isFractionDigitsInfinite = false;
        if(args.Info.Count > 1)
        {
            //use the first arg as the fraction digits, ignore the rest.
            Var aFractionDigits = args[1];

            // shortcut for tagged int's
            if(TaggedInt::Is(aFractionDigits))
            {
                fractionDigits = TaggedInt::ToInt32(aFractionDigits);
            }
            else if(JavascriptOperators::GetTypeId(aFractionDigits) == TypeIds_Undefined)
            {
                // fraction digits = 0
            }
            else
            {
                double fractionDigitsRaw = JavascriptConversion::ToInteger(aFractionDigits, scriptContext);
                isFractionDigitsInfinite =
                    fractionDigitsRaw == JavascriptNumber::NEGATIVE_INFINITY ||
                    fractionDigitsRaw == JavascriptNumber::POSITIVE_INFINITY;
                fractionDigits = (int)fractionDigitsRaw;
            }
        }

        if (fractionDigits < 0 || fractionDigits > 20)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_FractionOutOfRange);
        }

        if(IsNan(value))
        {
            return ToStringNan(scriptContext);
        }
        if(value >= 1e21 || value <= -1e21)
        {
            return ToStringRadix10(value, scriptContext);
        }

        return FormatDoubleToString(value, NumberUtilities::FormatFixed, fractionDigits, scriptContext);

    }